

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O0

pool_ptr<soul::AST::Function> __thiscall
soul::ResolutionPass::GenericFunctionResolver::getOrCreateSpecialisedFunction
          (GenericFunctionResolver *this,CallOrCast *call,Function *genericFunction,
          ArrayView<soul::Type> callerArgumentTypes,bool shouldIgnoreErrors)

{
  Allocator *this_00;
  ArrayView<soul::Type> callerArgumentTypes_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Function *pFVar3;
  string *__rhs;
  char *__rhs_00;
  Function *function;
  TypeArray *types;
  undefined7 in_register_00000089;
  undefined1 auVar4 [16];
  byte in_stack_00000008;
  __type_conflict1 local_251;
  pool_ptr<soul::AST::Function> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string *local_1d0;
  Function *local_1c8;
  Function *newFunction;
  string local_1b8;
  pool_ref *local_198;
  pool_ref<soul::AST::Function> *f;
  pool_ref<soul::AST::Function> *__end3;
  pool_ref<soul::AST::Function> *__begin3;
  pool_ref<soul::AST::Function> *local_178;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *local_170;
  ArrayView<soul::pool_ref<soul::AST::Function>_> *__range3;
  string callerSignatureID;
  undefined1 local_120 [8];
  TypeArray resolvedTypes;
  Scope *parentScope;
  bool shouldIgnoreErrors_local;
  Function *genericFunction_local;
  CallOrCast *call_local;
  GenericFunctionResolver *this_local;
  ArrayView<soul::Type> callerArgumentTypes_local;
  
  callerArgumentTypes_00.e._1_7_ = in_register_00000089;
  callerArgumentTypes_00.e._0_1_ = shouldIgnoreErrors;
  function = (Function *)callerArgumentTypes.s;
  iVar2 = (*(function->super_ASTObject)._vptr_ASTObject[3])();
  resolvedTypes.space[0x17] = CONCAT44(extraout_var,iVar2);
  checkAssertion(resolvedTypes.space[0x17] != 0,"parentScope != nullptr",
                 "getOrCreateSpecialisedFunction",0xaa1);
  ArrayWithPreallocation<soul::Type,_8UL>::ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_120);
  callerArgumentTypes_00.s = callerArgumentTypes.e;
  bVar1 = findGenericFunctionTypes
                    ((GenericFunctionResolver *)call,(CallOrCast *)genericFunction,function,
                     callerArgumentTypes_00,(ArrayWithPreallocation<soul::Type,_8UL> *)local_120,
                     (bool)(in_stack_00000008 & 1));
  if (bVar1) {
    ASTUtilities::getTypeArraySignature_abi_cxx11_
              ((string *)&__range3,(ASTUtilities *)local_120,types);
    auVar4 = (**(code **)(*(long *)resolvedTypes.space[0x17] + 0x68))();
    local_178 = auVar4._8_8_;
    __begin3 = auVar4._0_8_;
    local_170 = (ArrayView<soul::pool_ref<soul::AST::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::AST::Function>_>::begin(local_170);
    f = ArrayView<soul::pool_ref<soul::AST::Function>_>::end(local_170);
    for (; __end3 != f; __end3 = __end3 + 1) {
      local_198 = (pool_ref *)__end3;
      pFVar3 = pool_ref<soul::AST::Function>::operator->(__end3);
      bVar1 = pool_ptr<soul::AST::Function>::operator==(&pFVar3->originalGenericFunction,function);
      newFunction._7_1_ = 0;
      local_251 = false;
      if (bVar1) {
        pFVar3 = pool_ref::operator_cast_to_Function_(local_198);
        getIDStringForFunction_abi_cxx11_(&local_1b8,(GenericFunctionResolver *)call,pFVar3);
        newFunction._7_1_ = 1;
        local_251 = std::operator==(&local_1b8,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range3);
      }
      if ((newFunction._7_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      if (local_251 != false) {
        pool_ref::operator_cast_to_pool_ptr((pool_ref *)this);
        goto LAB_003d0e81;
      }
    }
    local_1c8 = StructuralParser::cloneFunction
                          ((Allocator *)
                           (call->super_CallOrCastBase).super_Expression.super_Statement.
                           super_ASTObject.context.location.location.data,function);
    this_00 = (Allocator *)
              (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
              location.location.data;
    __rhs = Identifier::toString_abi_cxx11_(&function->name);
    std::operator+(&local_210,"_",__rhs);
    __rhs_00 = heart::getGenericSpecialisationNameTag();
    std::operator+(&local_1f0,&local_210,__rhs_00);
    local_1d0 = (string *)AST::Allocator::get<std::__cxx11::string>(this_00,&local_1f0);
    (local_1c8->name).name = local_1d0;
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    pool_ptr<soul::AST::Function>::pool_ptr<soul::AST::Function,void>(&local_218,function);
    (local_1c8->originalGenericFunction).object = local_218.object;
    pool_ptr<soul::AST::Function>::~pool_ptr(&local_218);
    applyGenericFunctionTypes((GenericFunctionResolver *)call,local_1c8,(TypeArray *)local_120);
    pool_ptr<soul::AST::Function>::pool_ptr<soul::AST::Function,void>
              ((pool_ptr<soul::AST::Function> *)this,local_1c8);
LAB_003d0e81:
    newFunction._0_4_ = 1;
    std::__cxx11::string::~string((string *)&__range3);
  }
  else {
    pool_ptr<soul::AST::Function>::pool_ptr((pool_ptr<soul::AST::Function> *)this);
    newFunction._0_4_ = 1;
  }
  ArrayWithPreallocation<soul::Type,_8UL>::~ArrayWithPreallocation
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_120);
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<AST::Function> getOrCreateSpecialisedFunction (AST::CallOrCast& call,
                                                                AST::Function& genericFunction,
                                                                ArrayView<Type> callerArgumentTypes,
                                                                bool shouldIgnoreErrors)
        {
            auto parentScope = genericFunction.getParentScope();
            SOUL_ASSERT (parentScope != nullptr);

            AST::TypeArray resolvedTypes;

            if (findGenericFunctionTypes (call, genericFunction, callerArgumentTypes, resolvedTypes, shouldIgnoreErrors))
            {
                auto callerSignatureID = ASTUtilities::getTypeArraySignature (resolvedTypes);

                for (auto& f : parentScope->getFunctions())
                    if (f->originalGenericFunction == genericFunction && getIDStringForFunction (f) == callerSignatureID)
                        return f;

                auto& newFunction = StructuralParser::cloneFunction (allocator, genericFunction);
                newFunction.name = allocator.get ("_" + genericFunction.name.toString() + heart::getGenericSpecialisationNameTag());
                newFunction.originalGenericFunction = genericFunction;
                applyGenericFunctionTypes (newFunction, resolvedTypes);

                return newFunction;
            }

            return {};
        }